

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O3

UniformFEDofHandler * __thiscall
lf::uscalfe::UniformScalarFESpace<double>::InitDofHandler
          (UniformFEDofHandler *__return_storage_ptr__,UniformScalarFESpace<double> *this,
          shared_ptr<const_lf::mesh::Mesh> *mesh_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  int iVar8;
  runtime_error *prVar9;
  ostream *poVar10;
  element_type *peVar11;
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  dof_map_t rsf_layout;
  string local_250;
  string local_230;
  string local_210;
  shared_ptr<const_lf::mesh::Mesh> local_1f0;
  undefined1 local_1e0 [392];
  _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_58;
  
  peVar3 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),"Missing mesh!",0xd);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"mesh_p != nullptr","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_230,&local_250,0xf4,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                               local_230.field_2._M_allocated_capacity._0_4_) + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->rfs_tria_p_).
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0 &&
      (this->rfs_quad_p_).
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),"Missing FE specification for cells",0x22);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"(rfs_quad_p_ != nullptr) || (rfs_tria_p_ != nullptr)","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_230,&local_250,0xf6,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                               local_230.field_2._M_allocated_capacity._0_4_) + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar5 = (**peVar3->_vptr_Mesh)();
  if (iVar5 != 2) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),"Only for 2D meshes",0x12);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"(mesh_p->DimMesh() == 2)","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_230,&local_250,0xf7,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                               local_230.field_2._M_allocated_capacity._0_4_) + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar5 = (*peVar3->_vptr_Mesh[4])(peVar3,3);
  if ((iVar5 != 0) &&
     ((this->rfs_tria_p_).
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),
               "Missing FE specification for triangles though mesh contains some",0x40);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "(mesh_p->NumEntities(lf::base::RefEl::kTria()) == 0) || (rfs_tria_p_ != nullptr)",""
              );
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_230,&local_250,0xfd,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                               local_230.field_2._M_allocated_capacity._0_4_) + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar3 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar5 = (*peVar3->_vptr_Mesh[4])(peVar3,4);
  peVar11 = (this->rfs_quad_p_).
            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (peVar11 == (element_type *)0x0 && iVar5 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1e0 + 0x10),
               "Missing FE specification for quads though mesh contains some",0x3c);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,
               "(mesh_p->NumEntities(lf::base::RefEl::kQuad()) == 0) || (rfs_quad_p_ != nullptr)",""
              );
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_230,&local_250,0x100,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                               local_230.field_2._M_allocated_capacity._0_4_) + 1);
    }
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar9,"this code should not be reached");
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar4 = (this->rfs_tria_p_).
           super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    iVar5 = (*peVar4->_vptr_ScalarReferenceFiniteElement[2])(peVar4);
    if ((char)iVar5 != '\x03') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),"Wrong type for triangle!",0x18);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"(*rfs_tria_p_).RefEl() == lf::base::RefEl::kTria()","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x108,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar11 = (this->rfs_tria_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    uVar6 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
    if (1 < uVar6) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),
                 "At most one shape function can be assigned to each vertex",0x39);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"(*rfs_tria_p_).NumRefShapeFunctions(2) <= 1","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x10a,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar11 = (this->rfs_tria_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
    this->num_rsf_node_ = sVar7;
    peVar11 = (this->rfs_tria_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
    this->num_rsf_edge_ = sVar7;
    peVar11 = (this->rfs_tria_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
    this->num_rsf_tria_ = sVar7;
    peVar11 = (this->rfs_quad_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  }
  if (peVar11 != (element_type *)0x0) {
    iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[2])();
    if ((char)iVar5 != '\x04') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),"Wrong type for quad!",0x14);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"(*rfs_quad_p_).RefEl() == lf::base::RefEl::kQuad()","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x113,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar11 = (this->rfs_quad_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    uVar6 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
    if (1 < uVar6) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),
                 "At most one shape function can be assigned to each vertex",0x39);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"(*rfs_quad_p_).NumRefShapeFunctions(2) <= 1","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x115,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar11 = (this->rfs_quad_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
    this->num_rsf_node_ = sVar7;
    peVar11 = (this->rfs_quad_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
    this->num_rsf_edge_ = sVar7;
    peVar11 = (this->rfs_quad_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
    this->num_rsf_quad_ = sVar7;
  }
  peVar11 = (this->rfs_edge_p_).
            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (peVar11 != (element_type *)0x0) {
    iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[2])();
    if ((char)iVar5 != '\x02') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),"Wrong type for edge!",0x14);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"(*rfs_edge_p_).RefEl() == lf::base::RefEl::kSegment()","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x11d,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar11 = (this->rfs_edge_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    uVar6 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
    if (1 < uVar6) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),
                 "At most one shape function can be assigned to each vertex",0x39);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"(*rfs_edge_p_).NumRefShapeFunctions(1) <= 1","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x11f,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar9,"this code should not be reached");
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar11 = (this->rfs_edge_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
    this->num_rsf_node_ = sVar7;
    peVar11 = (this->rfs_edge_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    sVar7 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
    this->num_rsf_edge_ = sVar7;
  }
  peVar11 = (this->rfs_tria_p_).
            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (peVar11 != (element_type *)0x0) {
    if ((this->rfs_quad_p_).
        super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
      peVar11 = (this->rfs_quad_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar8 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
      if (iVar5 != iVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1e0 + 0x10),"#RSF mismatch on nodes ",0x17);
        peVar11 = (this->rfs_tria_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1e0 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
        peVar11 = (this->rfs_quad_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        paVar1 = &local_230.field_2;
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,
                   "((*rfs_tria_p_).NumRefShapeFunctions(2) == (*rfs_quad_p_).NumRefShapeFunctions(2))"
                   ,"");
        paVar2 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_230,&local_250,300,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                   local_230.field_2._M_allocated_capacity._0_4_) + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
        base::AssertionFailed(&local_230,&local_250,300,&local_210);
        goto LAB_0013039e;
      }
      peVar11 = (this->rfs_tria_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      peVar11 = (this->rfs_quad_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar8 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      if (iVar5 != iVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1e0 + 0x10),"#RSF mismatch on edges ",0x17);
        peVar11 = (this->rfs_tria_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1e0 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
        peVar11 = (this->rfs_quad_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        paVar1 = &local_230.field_2;
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,
                   "((*rfs_tria_p_).NumRefShapeFunctions(1) == (*rfs_quad_p_).NumRefShapeFunctions(1))"
                   ,"");
        paVar2 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_230,&local_250,0x131,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                   local_230.field_2._M_allocated_capacity._0_4_) + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
        base::AssertionFailed(&local_230,&local_250,0x131,&local_210);
        goto LAB_0013039e;
      }
      peVar11 = (this->rfs_tria_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (peVar11 == (element_type *)0x0) goto LAB_0012ed7b;
    }
    if ((this->rfs_edge_p_).
        super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
      peVar11 = (this->rfs_edge_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar8 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      if (iVar5 != iVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1e0 + 0x10),"#RSF mismatch on nodes ",0x17);
        peVar11 = (this->rfs_tria_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1e0 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
        peVar11 = (this->rfs_edge_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        paVar1 = &local_230.field_2;
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,
                   "((*rfs_tria_p_).NumRefShapeFunctions(2) == (*rfs_edge_p_).NumRefShapeFunctions(1))"
                   ,"");
        paVar2 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_230,&local_250,0x138,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                   local_230.field_2._M_allocated_capacity._0_4_) + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
        base::AssertionFailed(&local_230,&local_250,0x138,&local_210);
        goto LAB_0013039e;
      }
      peVar11 = (this->rfs_tria_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      peVar11 = (this->rfs_edge_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar8 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
      if (iVar5 != iVar8) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1e0 + 0x10),"#RSF mismatch on edges ",0x17);
        peVar11 = (this->rfs_tria_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1e0 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
        peVar11 = (this->rfs_edge_p_).
                  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        paVar1 = &local_230.field_2;
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,
                   "((*rfs_tria_p_).NumRefShapeFunctions(1) == (*rfs_edge_p_).NumRefShapeFunctions(0))"
                   ,"");
        paVar2 = &local_250.field_2;
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_230,&local_250,0x13d,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,
                          CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                   local_230.field_2._M_allocated_capacity._0_4_) + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
        local_250._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                   ,"");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
        base::AssertionFailed(&local_230,&local_250,0x13d,&local_210);
        goto LAB_0013039e;
      }
    }
  }
LAB_0012ed7b:
  peVar11 = (this->rfs_quad_p_).
            super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((peVar11 != (element_type *)0x0) &&
     ((this->rfs_edge_p_).
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0)) {
    iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
    peVar11 = (this->rfs_edge_p_).
              super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    iVar8 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
    if (iVar5 == iVar8) {
      peVar11 = (this->rfs_quad_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar5 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      peVar11 = (this->rfs_edge_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      iVar8 = (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
      if (iVar5 == iVar8) goto LAB_0012edd4;
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),"#RSF mismatch on edges ",0x17);
      peVar11 = (this->rfs_quad_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1e0 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
      peVar11 = (this->rfs_edge_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,0);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      paVar1 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "((*rfs_quad_p_).NumRefShapeFunctions(1) == (*rfs_edge_p_).NumRefShapeFunctions(0))"
                 ,"");
      paVar2 = &local_250.field_2;
      local_250._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x149,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
      local_250._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      base::AssertionFailed(&local_230,&local_250,0x149,&local_210);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1e0 + 0x10),"#RSF mismatch on edges ",0x17);
      peVar11 = (this->rfs_quad_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,2);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1e0 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," <-> ",5);
      peVar11 = (this->rfs_edge_p_).
                super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar11->_vptr_ScalarReferenceFiniteElement[5])(peVar11,1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      paVar1 = &local_230.field_2;
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "((*rfs_quad_p_).NumRefShapeFunctions(2) == (*rfs_edge_p_).NumRefShapeFunctions(1))"
                 ,"");
      paVar2 = &local_250.field_2;
      local_250._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_230,&local_250,0x144,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != paVar2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT44(local_230.field_2._M_allocated_capacity._4_4_,
                                 local_230.field_2._M_allocated_capacity._0_4_) + 1);
      }
      local_230._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"false","");
      local_250._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,"");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      base::AssertionFailed(&local_230,&local_250,0x144,&local_210);
    }
LAB_0013039e:
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    abort();
  }
LAB_0012edd4:
  local_230._M_dataplus._M_p._0_1_ = 1;
  local_230._M_dataplus._M_p._4_4_ = this->num_rsf_node_;
  local_230._M_string_length._0_1_ = 2;
  local_230._M_string_length._4_4_ = this->num_rsf_edge_;
  local_230.field_2._M_local_buf[0] = 3;
  local_230.field_2._M_allocated_capacity._4_4_ = this->num_rsf_tria_;
  local_230.field_2._M_local_buf[8] = '\x04';
  local_230.field_2._12_4_ = this->num_rsf_quad_;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_230;
  std::
  map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::map((map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
         *)local_1e0,__l,(less<lf::base::RefEl> *)&local_250,(allocator_type *)&local_210);
  local_1f0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1f0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  std::
  _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::_Rb_tree(&local_58,
             (_Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
              *)local_1e0);
  assemble::UniformFEDofHandler::UniformFEDofHandler
            (__return_storage_ptr__,&local_1f0,(dof_map_t *)&local_58,true);
  std::
  _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::~_Rb_tree(&local_58);
  if (local_1f0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f0.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
               *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

assemble::UniformFEDofHandler UniformScalarFESpace<SCALAR>::InitDofHandler(
    std::shared_ptr<const lf::mesh::Mesh> mesh_p) {
  // Check validity and consistency of mesh pointer
  LF_VERIFY_MSG(mesh_p != nullptr, "Missing mesh!");
  LF_VERIFY_MSG((rfs_quad_p_ != nullptr) || (rfs_tria_p_ != nullptr),
                "Missing FE specification for cells");
  LF_VERIFY_MSG((mesh_p->DimMesh() == 2), "Only for 2D meshes");

  // Check whether all required finite element specifications are provided
  LF_VERIFY_MSG(
      (mesh_p->NumEntities(lf::base::RefEl::kTria()) == 0) ||
          (rfs_tria_p_ != nullptr),
      "Missing FE specification for triangles though mesh contains some");
  LF_VERIFY_MSG((mesh_p->NumEntities(lf::base::RefEl::kQuad()) == 0) ||
                    (rfs_quad_p_ != nullptr),
                "Missing FE specification for quads though mesh contains some");

  // Compatibility checks and initialization of numbers of shape functions
  // In particular only a single shape function may be associated to a node
  // in the case of a SCALAR finite element space
  if (rfs_tria_p_ != nullptr) {
    // Probe local shape functions on a triangle
    LF_VERIFY_MSG((*rfs_tria_p_).RefEl() == lf::base::RefEl::kTria(),
                  "Wrong type for triangle!");
    LF_VERIFY_MSG((*rfs_tria_p_).NumRefShapeFunctions(2) <= 1,
                  "At most one shape function can be assigned to each vertex");
    // Initialize numbers of shape functions associated to entities
    num_rsf_node_ = (*rfs_tria_p_).NumRefShapeFunctions(2);
    num_rsf_edge_ = (*rfs_tria_p_).NumRefShapeFunctions(1);
    num_rsf_tria_ = (*rfs_tria_p_).NumRefShapeFunctions(0);
  }
  if (rfs_quad_p_ != nullptr) {
    // Probe local shape functions for QUADs
    LF_VERIFY_MSG((*rfs_quad_p_).RefEl() == lf::base::RefEl::kQuad(),
                  "Wrong type for quad!");
    LF_VERIFY_MSG((*rfs_quad_p_).NumRefShapeFunctions(2) <= 1,
                  "At most one shape function can be assigned to each vertex");
    // Initialize numbers of shape functions associated to entities
    num_rsf_node_ = (*rfs_quad_p_).NumRefShapeFunctions(2);
    num_rsf_edge_ = (*rfs_quad_p_).NumRefShapeFunctions(1);
    num_rsf_quad_ = (*rfs_quad_p_).NumRefShapeFunctions(0);
  }
  if (rfs_edge_p_ != nullptr) {
    LF_VERIFY_MSG((*rfs_edge_p_).RefEl() == lf::base::RefEl::kSegment(),
                  "Wrong type for edge!");
    LF_VERIFY_MSG((*rfs_edge_p_).NumRefShapeFunctions(1) <= 1,
                  "At most one shape function can be assigned to each vertex");
    num_rsf_node_ = (*rfs_edge_p_).NumRefShapeFunctions(1);
    num_rsf_edge_ = (*rfs_edge_p_).NumRefShapeFunctions(0);
  }

  // Compatibility check for numbers of local shape functions associated with
  // edges. Those must be the same for all reference shape function descriptions
  // passed to the finite element space.
  if ((rfs_tria_p_ != nullptr) && (rfs_quad_p_ != nullptr)) {
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(2) ==
                   (*rfs_quad_p_).NumRefShapeFunctions(2)),
                  "#RSF mismatch on nodes "
                      << (*rfs_tria_p_).NumRefShapeFunctions(2) << " <-> "
                      << (*rfs_quad_p_).NumRefShapeFunctions(2));
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(1) ==
                   (*rfs_quad_p_).NumRefShapeFunctions(1)),
                  "#RSF mismatch on edges "
                      << (*rfs_tria_p_).NumRefShapeFunctions(1) << " <-> "
                      << (*rfs_quad_p_).NumRefShapeFunctions(1));
  }
  if ((rfs_tria_p_ != nullptr) && (rfs_edge_p_ != nullptr)) {
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(2) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(1)),
                  "#RSF mismatch on nodes "
                      << (*rfs_tria_p_).NumRefShapeFunctions(2) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(1));
    LF_ASSERT_MSG(((*rfs_tria_p_).NumRefShapeFunctions(1) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(0)),
                  "#RSF mismatch on edges "
                      << (*rfs_tria_p_).NumRefShapeFunctions(1) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(0));
  }
  if ((rfs_quad_p_ != nullptr) && (rfs_edge_p_ != nullptr)) {
    LF_ASSERT_MSG(((*rfs_quad_p_).NumRefShapeFunctions(2) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(1)),
                  "#RSF mismatch on edges "
                      << (*rfs_quad_p_).NumRefShapeFunctions(2) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(1));
    LF_ASSERT_MSG(((*rfs_quad_p_).NumRefShapeFunctions(1) ==
                   (*rfs_edge_p_).NumRefShapeFunctions(0)),
                  "#RSF mismatch on edges "
                      << (*rfs_quad_p_).NumRefShapeFunctions(1) << " <-> "
                      << (*rfs_edge_p_).NumRefShapeFunctions(0));
  }

  // Initialization of dof handler starting with collecting the number of
  // interior reference shape functions
  const lf::assemble::UniformFEDofHandler::dof_map_t rsf_layout{
      {lf::base::RefEl::kPoint(), num_rsf_node_},
      {lf::base::RefEl::kSegment(), num_rsf_edge_},
      {lf::base::RefEl::kTria(), num_rsf_tria_},
      {lf::base::RefEl::kQuad(), num_rsf_quad_}};

  // NOLINTNEXTLINE(modernize-return-braced-init-list)
  return lf::assemble::UniformFEDofHandler(std::move(mesh_p), rsf_layout);
}